

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O0

int stmm_foreach(stmm_table *table,_func_stmm_retval_char_ptr_char_ptr_char_ptr *func,char *arg)

{
  stmm_retval sVar1;
  int local_40;
  int i;
  stmm_retval retval;
  stmm_table_entry **last;
  stmm_table_entry *ptr;
  char *arg_local;
  _func_stmm_retval_char_ptr_char_ptr_char_ptr *func_local;
  stmm_table *table_local;
  
  local_40 = 0;
  do {
    if (table->num_bins <= local_40) {
      return 1;
    }
    _i = table->bins + local_40;
    last = (stmm_table_entry **)*_i;
    while (last != (stmm_table_entry **)0x0) {
      sVar1 = (*func)((char *)*last,(char *)last[1],arg);
      if (sVar1 == STMM_CONTINUE) {
        _i = last + 2;
        last = (stmm_table_entry **)*_i;
      }
      else {
        if (sVar1 == STMM_STOP) {
          return 0;
        }
        if (sVar1 == STMM_DELETE) {
          *_i = last[2];
          table->num_entries = table->num_entries + -1;
          Extra_MmFixedEntryRecycle((Extra_MmFixed_t *)table->pMemMan,(char *)last);
          last = (stmm_table_entry **)*_i;
        }
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int
stmm_foreach (stmm_table *table, enum stmm_retval (*func) (char *, char *, char *), char *arg)
{
    stmm_table_entry *ptr, **last;
    enum stmm_retval retval;
    int i;

    for (i = 0; i < table->num_bins; i++) {
    last = &table->bins[i];
    ptr = *last;
    while (ptr != NULL) {
        retval = (*func) (ptr->key, ptr->record, arg);
        switch (retval) {
        case STMM_CONTINUE:
        last = &ptr->next;
        ptr = *last;
        break;
        case STMM_STOP:
        return 0;
        case STMM_DELETE:
        *last = ptr->next;
        table->num_entries--;   /* cstevens@ic */
//                              ABC_FREE( ptr );
        Extra_MmFixedEntryRecycle ((Extra_MmFixed_t *)table->pMemMan, (char *) ptr);

        ptr = *last;
        }
    }
    }
    return 1;
}